

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_rand.cc
# Opt level: O3

cpp_gen * new_gamma_gen(double alpha,double beta)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  double *pdVar4;
  cpp_gen *pcVar5;
  size_t __i;
  long lVar6;
  double dVar7;
  random_device rd;
  random_device local_13a0;
  
  std::random_device::random_device(&local_13a0);
  puVar2 = (ulong *)operator_new(5000);
  uVar1 = std::random_device::_M_getval();
  uVar3 = (ulong)uVar1;
  *puVar2 = uVar3;
  lVar6 = 1;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar6);
    puVar2[lVar6] = uVar3;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  puVar2[0x270] = 0x270;
  pdVar4 = (double *)operator_new(0x40);
  *pdVar4 = alpha;
  pdVar4[1] = beta;
  dVar7 = (double)(~-(ulong)(alpha < 1.0) & (ulong)alpha |
                  (ulong)(alpha + 1.0) & -(ulong)(alpha < 1.0));
  pdVar4[2] = dVar7;
  dVar7 = (dVar7 + -0.3333333333333333) * 9.0;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  pdVar4[3] = 1.0 / dVar7;
  pdVar4[4] = 0.0;
  pdVar4[5] = 1.0;
  pdVar4[6] = 0.0;
  *(undefined1 *)(pdVar4 + 7) = 0;
  pcVar5 = (cpp_gen *)operator_new(0x10);
  pcVar5->d = pdVar4;
  pcVar5->gen = puVar2;
  std::random_device::_M_fini();
  return pcVar5;
}

Assistant:

struct cpp_gen *new_gamma_gen(double alpha, double beta) {
		std::random_device rd {};
		std::mt19937 *gen = new std::mt19937(rd());
		//std::default_random_engine *gen = new std::default_random_engine;

		std::gamma_distribution<double> *d = new std::gamma_distribution<double>(alpha, beta);
		struct cpp_gen *gg = new struct cpp_gen;
		gg->d = d;
		gg->gen = gen;
		return gg;

	}